

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseCWL.cpp
# Opt level: O1

void extractStructureLevel(Classification *result,string *c,size_t *i)

{
  int iVar1;
  pointer pcVar2;
  long *__nptr;
  int *piVar3;
  long lVar4;
  undefined8 uVar5;
  size_t sVar6;
  string level;
  long *local_50;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  pcVar2 = (c->_M_dataplus)._M_p;
  if (pcVar2[*i] == '-') {
    *i = *i + 1;
  }
  sVar6 = *i;
  while (sVar6 < c->_M_string_length) {
    if (9 < (int)pcVar2[sVar6] - 0x30U) {
      *i = sVar6 - 1;
      break;
    }
    sVar6 = sVar6 + 1;
    *i = sVar6;
  }
  std::__cxx11::string::substr((ulong)&local_48,(ulong)c);
  __nptr = local_48;
  if (local_40 != 0) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    *piVar3 = 0;
    lVar4 = strtol((char *)__nptr,(char **)&local_50,10);
    if (local_50 == __nptr) {
      std::__throw_invalid_argument("stoi");
    }
    else if (((int)lVar4 == lVar4) && (*piVar3 != 0x22)) {
      if (*piVar3 == 0) {
        *piVar3 = iVar1;
      }
      result->sectionLevel = (int)lVar4 + -1;
      goto LAB_0017fdc3;
    }
    uVar5 = std::__throw_out_of_range("stoi");
    if (*piVar3 == 0) {
      *piVar3 = iVar1;
    }
    extractStructureLevel();
    _Unwind_Resume(uVar5);
  }
LAB_0017fdc3:
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return;
}

Assistant:

void extractStructureLevel (Classification &result, string &c, size_t &i) {
    auto start = i;
    if (c[i] == '-') { i++; }
    for (; i < c.size(); i++) {
        if (!isdigit(c[i])) { i--; break; } // i will be incremented after
    }

    string level = c.substr(start, i - start);
    if (level.empty()) { return; }

    result.sectionLevel = std::stoi(level) - 1;
}